

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_echo_server.cpp
# Opt level: O0

void UdpServerReadCallback(sz_sock sockfd,Timestamp receiveTime)

{
  LogLevel LVar1;
  LogStream *pLVar2;
  self *psVar3;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  undefined1 local_3438 [12];
  Logger local_3428;
  int local_2454;
  char acStack_2450 [4];
  int sendBufSize;
  void *sendBuf;
  undefined4 local_2440;
  Logger local_2438;
  char local_1468 [8];
  char addrStr [64];
  undefined1 local_1418 [12];
  Logger local_1408;
  sz_ssize_t local_438;
  sz_ssize_t nr;
  sockaddr peerAddr;
  void *recvBuf;
  char message [1024];
  sz_sock sockfd_local;
  Timestamp receiveTime_local;
  
  peerAddr.sa_data._6_8_ = &recvBuf;
  message._1020_4_ = sockfd;
  memset(&nr,0,0x10);
  local_438 = sznet::net::sockets::sz_udp_recv
                        (message._1020_4_,(void *)peerAddr.sa_data._6_8_,0x400,(sockaddr *)&nr);
  if (local_438 < 0) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_1418,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1418._0_8_;
    file.m_size = local_1418._8_4_;
    sznet::Logger::Logger(&local_1408,file,0x2d,false);
    pLVar2 = sznet::Logger::stream(&local_1408);
    sznet::LogStream::operator<<(pLVar2,"sz_udp_recv");
    sznet::Logger::~Logger(&local_1408);
  }
  else {
    sznet::net::sockets::sz_toipport(local_1468,0x40,(sockaddr *)&nr);
    message[local_438 + -8] = '\0';
    LVar1 = sznet::Logger::logLevel();
    if ((int)LVar1 < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)&sendBuf,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
                );
      file_00._12_4_ = 0;
      file_00.m_data = (char *)sendBuf;
      file_00.m_size = local_2440;
      sznet::Logger::Logger(&local_2438,file_00,0x34);
      pLVar2 = sznet::Logger::stream(&local_2438);
      psVar3 = sznet::LogStream::operator<<(pLVar2,"recv: ");
      psVar3 = sznet::LogStream::operator<<(psVar3,(char *)&recvBuf);
      psVar3 = sznet::LogStream::operator<<(psVar3,", from: ");
      sznet::LogStream::operator<<(psVar3,local_1468);
      sznet::Logger::~Logger(&local_2438);
    }
    acStack_2450[0] = peerAddr.sa_data[6];
    acStack_2450[1] = peerAddr.sa_data[7];
    acStack_2450[2] = peerAddr.sa_data[8];
    acStack_2450[3] = peerAddr.sa_data[9];
    sendBufSize._0_1_ = peerAddr.sa_data[10];
    sendBufSize._1_1_ = peerAddr.sa_data[0xb];
    sendBufSize._2_1_ = peerAddr.sa_data[0xc];
    sendBufSize._3_1_ = peerAddr.sa_data[0xd];
    local_2454 = (int)local_438;
    local_438 = sznet::net::sockets::sz_udp_send
                          (message._1020_4_,(void *)peerAddr.sa_data._6_8_,local_2454,
                           (sockaddr *)&nr);
    LVar1 = sznet::Logger::logLevel();
    if ((int)LVar1 < 3) {
      sznet::Logger::SourceFile::SourceFile<115>
                ((SourceFile *)local_3438,
                 (char (*) [115])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/udp_echo/udp_echo_server.cpp"
                );
      file_01._12_4_ = 0;
      file_01.m_data = (char *)local_3438._0_8_;
      file_01.m_size = local_3438._8_4_;
      sznet::Logger::Logger(&local_3428,file_01,0x39);
      pLVar2 = sznet::Logger::stream(&local_3428);
      psVar3 = sznet::LogStream::operator<<(pLVar2,"echo send: ");
      psVar3 = sznet::LogStream::operator<<(psVar3,(char *)&recvBuf);
      psVar3 = sznet::LogStream::operator<<(psVar3,", to: ");
      sznet::LogStream::operator<<(psVar3,local_1468);
      sznet::Logger::~Logger(&local_3428);
    }
  }
  return;
}

Assistant:

void UdpServerReadCallback(sockets::sz_sock sockfd, sznet::Timestamp receiveTime)
{
    char message[1024];
    void* recvBuf = reinterpret_cast<void*>(&message);
    struct sockaddr peerAddr;
    memset(&peerAddr, 0, sizeof(peerAddr));
    
    sz_ssize_t nr = sockets::sz_udp_recv(sockfd, recvBuf, 1024, &peerAddr);
    if (nr < 0)
    {
        LOG_SYSERR << "sz_udp_recv";
        return;
    }

    char addrStr[64];
    sockets::sz_toipport(addrStr, sizeof(addrStr), &peerAddr);
    message[nr] = 0;
    LOG_INFO << "recv: " << message << ", from: " << addrStr;

    const void* sendBuf = const_cast<const void*>(recvBuf);
    int sendBufSize = static_cast<int>(nr);
    nr = sockets::sz_udp_send(sockfd, sendBuf, sendBufSize, &peerAddr);
    LOG_INFO << "echo send: " << message << ", to: " << addrStr;
}